

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libfsst.cpp
# Opt level: O2

ostream * operator<<(ostream *out,Symbol *s)

{
  u32 i;
  ulong uVar1;
  
  for (uVar1 = 0; uVar1 < (s->icl >> 0x1c & 0xffffffff); uVar1 = uVar1 + 1) {
    std::operator<<(out,(s->val).str[uVar1]);
  }
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const Symbol& s) {
	for (u32 i=0; i<s.length(); i++)
		out << s.val.str[i];
	return out;
}